

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Value(char *prefix,float v,char *float_format)

{
  char fmt [64];
  char local_58 [72];
  
  if (float_format != (char *)0x0) {
    ImFormatString(local_58,0x40,"%%s: %s",float_format);
    Text(local_58,(double)v,prefix);
    return;
  }
  Text("%s: %.3f",(double)v,prefix);
  return;
}

Assistant:

void ImGui::Value(const char* prefix, float v, const char* float_format)
{
    if (float_format)
    {
        char fmt[64];
        ImFormatString(fmt, IM_ARRAYSIZE(fmt), "%%s: %s", float_format);
        Text(fmt, prefix, v);
    }
    else
    {
        Text("%s: %.3f", prefix, v);
    }
}